

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall pstore::file::deleter_base::~deleter_base(deleter_base *this)

{
  char *in_RSI;
  
  this->_vptr_deleter_base = (_func_int **)&PTR__deleter_base_001db918;
  unlink(this,in_RSI);
  std::_Function_base::~_Function_base(&(this->unlinker_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->path_);
  return;
}

Assistant:

deleter_base::~deleter_base () noexcept {
            no_ex_escape ([this] () { this->unlink (); });
        }